

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void output_out_edges(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  out_edge_t peVar1;
  char *pcVar2;
  char *pcVar3;
  
  fwrite("  out edges:",0xc,1,(FILE *)gen_ctx->debug_file);
  for (peVar1 = (bb->out_edges).head; peVar1 != (out_edge_t)0x0; peVar1 = (peVar1->out_link).next) {
    pcVar2 = "f";
    if (peVar1->fall_through_p == '\0') {
      pcVar2 = "";
    }
    pcVar3 = "*";
    if (peVar1->back_edge_p == '\0') {
      pcVar3 = "";
    }
    fprintf((FILE *)gen_ctx->debug_file," %3lu%s%s",peVar1->dst->index,pcVar2,pcVar3);
  }
  fputc(10,(FILE *)gen_ctx->debug_file);
  return;
}

Assistant:

static void output_out_edges (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e;

  fprintf (debug_file, "  out edges:");
  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e)) {
    fprintf (debug_file, " %3lu%s%s", (unsigned long) e->dst->index, e->fall_through_p ? "f" : "",
             e->back_edge_p ? "*" : "");
  }
  fprintf (debug_file, "\n");
}